

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

void __thiscall
SQCompilation::SQParser::checkSuspiciousUnaryOp
          (SQParser *this,SQInteger pprevTok,SQInteger tok,uint pprevFlags)

{
  char *pcVar1;
  
  if ((((tok == 0x2d) || (tok == 0x2b)) &&
      ((this->_expression_context | SQE_SWITCH) == SQE_ARRAY_ELEM)) &&
     ((pprevTok != 0x2c && (pprevFlags & 3) != 0 && (((this->_lex)._prevflags & 2) == 0)))) {
    pcVar1 = "--";
    if (tok == 0x2b) {
      pcVar1 = "++";
    }
    reportDiagnostic(this,0x70,pcVar1 + 1);
    return;
  }
  return;
}

Assistant:

void SQParser::checkSuspiciousUnaryOp(SQInteger pprevTok, SQInteger tok, unsigned pprevFlags) {
  if (tok == _SC('+') || tok == _SC('-')) {
    if (_expression_context == SQE_ARRAY_ELEM || _expression_context == SQE_FUNCTION_ARG) {
      if ((pprevFlags & (TF_PREP_EOL | TF_PREP_SPACE)) && (pprevTok != _SC(',')) && ((_lex._prevflags & TF_PREP_SPACE) == 0)) {
        reportDiagnostic(DiagnosticsId::DI_NOT_UNARY_OP, tok == _SC('+') ? "+" : "-");
      }
    }
  }
}